

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_construction.h
# Opt level: O0

void ximu::PacketConstruction::
     constructWriteDateTimePacket<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (DateTimeData *data,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  initializer_list<unsigned_char> __l;
  uchar uVar13;
  size_t sVar14;
  iterator iVar15;
  size_type sVar16;
  reference pvVar17;
  iterator end;
  allocator<unsigned_char> local_49;
  uchar local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  byte local_44;
  byte local_43;
  byte local_42;
  undefined1 local_41;
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> decoded;
  DateTimeData *data_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dest_local;
  
  local_48 = '\x05';
  decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)data;
  sVar14 = DateTimeData::year(data);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (sVar14 - 2000) + ((sVar14 - 2000) / 100) * -100;
  sVar14 = DateTimeData::year((DateTimeData *)
                              decoded.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar14 - 2000;
  local_47 = (byte)(SUB164(auVar1 * ZEXT816(0x199999999999999a),8) << 4) |
             (char)(sVar14 - 2000) +
             ((byte)(SUB164(auVar2 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5;
  sVar14 = DateTimeData::month((DateTimeData *)
                               decoded.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar14 % 100;
  sVar14 = DateTimeData::month((DateTimeData *)
                               decoded.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = sVar14;
  local_46 = (byte)(SUB164(auVar3 * ZEXT816(0x199999999999999a),8) << 4) |
             (char)sVar14 +
             ((byte)(SUB164(auVar4 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5;
  sVar14 = DateTimeData::day((DateTimeData *)
                             decoded.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar14 % 100;
  sVar14 = DateTimeData::day((DateTimeData *)
                             decoded.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar14;
  local_45 = (byte)(SUB164(auVar5 * ZEXT816(0x199999999999999a),8) << 4) |
             (char)sVar14 +
             ((byte)(SUB164(auVar6 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5;
  sVar14 = DateTimeData::hours((DateTimeData *)
                               decoded.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = sVar14 % 100;
  sVar14 = DateTimeData::hours((DateTimeData *)
                               decoded.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = sVar14;
  local_44 = (byte)(SUB164(auVar7 * ZEXT816(0x199999999999999a),8) << 4) |
             (char)sVar14 +
             ((byte)(SUB164(auVar8 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5;
  sVar14 = DateTimeData::minutes
                     ((DateTimeData *)
                      decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = sVar14 % 100;
  sVar14 = DateTimeData::minutes
                     ((DateTimeData *)
                      decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = sVar14;
  local_43 = (byte)(SUB164(auVar9 * ZEXT816(0x199999999999999a),8) << 4) |
             (char)sVar14 +
             ((byte)(SUB164(auVar10 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5;
  sVar14 = DateTimeData::seconds
                     ((DateTimeData *)
                      decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = sVar14 % 100;
  sVar14 = DateTimeData::seconds
                     ((DateTimeData *)
                      decoded.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = sVar14;
  local_42 = (byte)(SUB164(auVar11 * ZEXT816(0x199999999999999a),8) << 4) |
             (char)sVar14 +
             ((byte)(SUB164(auVar12 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5;
  local_41 = 0;
  local_40 = &local_48;
  local_38 = 8;
  std::allocator<unsigned_char>::allocator(&local_49);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,__l,&local_49);
  std::allocator<unsigned_char>::~allocator(&local_49);
  iVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar16 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  uVar13 = checksum<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                     ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       )iVar15._M_current,sVar16 - 1);
  pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  *pvVar17 = uVar13;
  iVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  PacketEncoding::
  encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar15._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )end._M_current,dest);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

static void constructWriteDateTimePacket(const DateTimeData& data,
                                         OutputIterator dest) {
  std::vector<unsigned char> decoded = {
    static_cast<unsigned char>(PacketHeaders::WRITE_DATETIME),
    static_cast<unsigned char>((((((data.year() - 2000) % 100) / 10) << 4)
      | (data.year() - 2000) % 10)),
    static_cast<unsigned char>(((((data.month() % 100) / 10) << 4)
      | (data.month() % 10))),
    static_cast<unsigned char>(((((data.day() % 100) / 10) << 4)	
      | (data.day() % 10))),
    static_cast<unsigned char>(((((data.hours() % 100) / 10) << 4)
      | (data.hours() % 10))),
    static_cast<unsigned char>(((((data.minutes() % 100) / 10) << 4)
      | (data.minutes() % 10))),
     static_cast<unsigned char>(((((data.seconds() % 100) / 10) << 4)
      | (data.seconds() % 10))),
      0
  };
  decoded.back() = checksum(decoded.begin(), decoded.size() - 1);
  PacketEncoding::encodePacket(decoded.begin(), decoded.end(), dest);
}